

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  *this_00;
  _Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false> _Var1;
  const_iterator cVar2;
  pointer __p_1;
  pointer paVar3;
  const_iterator end;
  padding_info pVar4;
  padding_info padding;
  padding_info padding_00;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  user_chars;
  _Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false> local_48;
  const_iterator local_40;
  _Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false> local_38;
  
  end._M_current = (pattern->_M_dataplus)._M_p + pattern->_M_string_length;
  local_48._M_head_impl = (pointer)0x0;
  this_00 = &this->formatters_;
  std::
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ::clear(this_00);
  paVar3 = (pointer)(pattern->_M_dataplus)._M_p;
  while (_Var1._M_head_impl = local_48._M_head_impl, local_40._M_current = (char *)paVar3,
        paVar3 != (pointer)end._M_current) {
    if (*(char *)&(paVar3->super_flag_formatter)._vptr_flag_formatter == '%') {
      if (local_48._M_head_impl != (pointer)0x0) {
        local_48._M_head_impl = (pointer)0x0;
        local_38._M_head_impl = _Var1._M_head_impl;
        std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
        ::
        emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                  ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                    *)this_00,
                   (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                    *)&local_38);
        if (local_38._M_head_impl != (pointer)0x0) {
          (*((local_38._M_head_impl)->super_flag_formatter)._vptr_flag_formatter[1])();
        }
      }
      local_40._M_current = (char *)((long)&(paVar3->super_flag_formatter)._vptr_flag_formatter + 1)
      ;
      pVar4 = handle_padspec_(&local_40,end);
      cVar2._M_current = local_40._M_current;
      if (local_40._M_current == end._M_current) break;
      pattern = (string *)((ulong)pattern & 0xffff000000000000 | pVar4._8_8_ & 0xffffffffffff);
      if ((pVar4._8_8_ >> 0x28 & 1) == 0) {
        padding._8_8_ = pattern;
        padding.width_ = pVar4.width_;
        handle_flag_<spdlog::details::null_scoped_padder>(this,*local_40._M_current,padding);
        local_40._M_current = cVar2._M_current;
      }
      else {
        padding_00._8_8_ = pattern;
        padding_00.width_ = pVar4.width_;
        handle_flag_<spdlog::details::scoped_padder>(this,*local_40._M_current,padding_00);
        local_40._M_current = cVar2._M_current;
      }
    }
    else {
      if (local_48._M_head_impl == (pointer)0x0) {
        details::make_unique<spdlog::details::aggregate_formatter>();
        _Var1._M_head_impl = local_38._M_head_impl;
        local_38._M_head_impl = (pointer)0x0;
        std::
        __uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
        ::reset((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                 *)&local_48,_Var1._M_head_impl);
        std::
        unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
        ::~unique_ptr((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       *)&local_38);
      }
      std::__cxx11::string::push_back((char)local_48._M_head_impl + '\x18');
    }
    paVar3 = (pointer)((long)&(((pointer)local_40._M_current)->super_flag_formatter).
                              _vptr_flag_formatter + 1);
  }
  _Var1._M_head_impl = local_48._M_head_impl;
  if (local_48._M_head_impl != (pointer)0x0) {
    local_48._M_head_impl = (pointer)0x0;
    local_40._M_current = (char *)_Var1._M_head_impl;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)this_00,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    if ((pointer)local_40._M_current != (pointer)0x0) {
      (**(code **)(*(long *)local_40._M_current + 8))();
    }
  }
  std::
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  ::~unique_ptr((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                 *)&local_48);
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}